

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::istream_cs_ext::input(istream *in)

{
  element_type *peVar1;
  proxy *in_RDI;
  string str;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::string(local_30);
  peVar1 = std::
           __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_RDI);
  std::operator>>(peVar1,local_30);
  parse_value(in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_30);
  return (var)in_RDI;
}

Assistant:

var input(istream &in)
		{
			std::string str;
			*in >> str;
			return parse_value(str);
		}